

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rc_model_v2.c
# Opt level: O1

MPP_RET reenc_calc_super_frm_ratio(void *ctx,EncRcTaskInfo *cfg)

{
  int iVar1;
  int iVar2;
  
  if (((byte)rc_debug & 1) != 0) {
    _mpp_log_l(4,"rc_model_v2","enter %p\n","reenc_calc_super_frm_ratio",ctx);
  }
  iVar1 = (((cfg->bit_real - *(int *)((long)ctx + 0x200)) * 4) / cfg->bit_target) * 0xa0;
  iVar2 = 0x280;
  if (iVar1 < 0x280) {
    iVar2 = iVar1;
  }
  iVar1 = 0x80;
  if (0x80 < iVar2) {
    iVar1 = iVar2;
  }
  *(int *)((long)ctx + 0x230) = iVar1;
  if (((byte)rc_debug & 1) != 0) {
    _mpp_log_l(4,"rc_model_v2","leave %p\n","reenc_calc_super_frm_ratio",ctx);
  }
  return MPP_OK;
}

Assistant:

MPP_RET reenc_calc_super_frm_ratio(void *ctx, EncRcTaskInfo *cfg)
{
    RcModelV2Ctx *p = (RcModelV2Ctx *)ctx;

    rc_dbg_func("enter %p\n", p);
    p->next_ratio = 160 * (4 * (cfg->bit_real - p->cur_super_thd) / cfg->bit_target);
    p->next_ratio = mpp_clip(p->next_ratio, 128, 640);
    rc_dbg_func("leave %p\n", p);
    return MPP_OK;
}